

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache_ptr.cc
# Opt level: O2

ThreadCache * tcmalloc::ThreadCachePtr::ReleaseAndClear(void)

{
  ThreadCache *pTVar1;
  long *in_FS_OFFSET;
  
  pTVar1 = (ThreadCache *)*in_FS_OFFSET;
  if (pTVar1 != (ThreadCache *)0x0) {
    *in_FS_OFFSET = 0;
    pthread_setspecific(tls_key_,(void *)0x0);
  }
  return pTVar1;
}

Assistant:

ThreadCache* ThreadCachePtr::ReleaseAndClear() {
  ThreadCache* cache = GetIfPresent();

  if (cache) {
    ClearCacheTLS();
    SetTlsValue(tls_key_, nullptr);
  }
  return cache;
}